

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int UTF8ToUTF16BE(uchar *outb,int *outlen,uchar *in,int *inlen)

{
  int iVar1;
  byte *pbVar2;
  byte bVar4;
  uint uVar3;
  int iVar5;
  long lVar6;
  byte *pbVar7;
  uint uVar8;
  long lVar9;
  byte *pbVar10;
  bool bVar11;
  
  if (inlen == (int *)0x0 || (outlen == (int *)0x0 || outb == (uchar *)0x0)) {
    iVar1 = -1;
  }
  else if (in == (uchar *)0x0) {
    *outlen = 0;
    *inlen = 0;
    iVar1 = 0;
  }
  else {
    pbVar7 = in + *inlen;
    iVar1 = *outlen;
    pbVar2 = outb;
    pbVar10 = in;
    while( true ) {
      iVar5 = (int)pbVar10;
      if (pbVar7 <= pbVar10) break;
      bVar4 = *pbVar10;
      uVar3 = (uint)bVar4;
      uVar8 = 0;
      if ((char)bVar4 < '\0') {
        if (bVar4 < 0xc0) {
LAB_00143787:
          *outlen = (int)((ulong)((long)pbVar2 - (long)outb) >> 1);
          *inlen = iVar5 - (int)in;
          return -2;
        }
        uVar3 = (uint)bVar4;
        if (bVar4 < 0xe0) {
          uVar3 = uVar3 & 0x1f;
          uVar8 = 1;
        }
        else if (bVar4 < 0xf0) {
          uVar3 = uVar3 & 0xf;
          uVar8 = 2;
        }
        else {
          if (0xf7 < bVar4) goto LAB_00143787;
          uVar3 = uVar3 & 7;
          uVar8 = 3;
        }
      }
      pbVar10 = pbVar10 + 1;
      if ((long)pbVar7 - (long)pbVar10 < (long)(ulong)uVar8) break;
      while ((bVar11 = uVar8 != 0, uVar8 = uVar8 - 1, bVar11 && (pbVar10 < pbVar7))) {
        bVar4 = *pbVar10;
        pbVar10 = pbVar10 + 1;
        if ((bVar4 & 0xffffffc0) != 0x80) break;
        uVar3 = uVar3 << 6 | bVar4 & 0x3f;
      }
      bVar4 = (byte)(uVar3 >> 8);
      if (uVar3 < 0x10000) {
        if (outb + (long)(iVar1 / 2) * 2 <= pbVar2) break;
        *pbVar2 = bVar4;
        lVar6 = 1;
        lVar9 = 2;
      }
      else {
        if ((0x10ffff < uVar3) || (outb + (long)(iVar1 / 2) * 2 <= pbVar2 + 2)) break;
        *pbVar2 = (byte)(uVar3 - 0x10000 >> 0x12) | 0xd8;
        pbVar2[1] = (byte)(uVar3 - 0x10000 >> 10);
        pbVar2[2] = bVar4 & 3 | 0xdc;
        lVar6 = 3;
        lVar9 = 4;
      }
      pbVar2[lVar6] = (byte)uVar3;
      pbVar2 = pbVar2 + lVar9;
    }
    *outlen = (int)pbVar2 - (int)outb;
    *inlen = iVar5 - (int)in;
    iVar1 = *outlen;
  }
  return iVar1;
}

Assistant:

static int
UTF8ToUTF16BE(unsigned char* outb, int *outlen,
            const unsigned char* in, int *inlen)
{
    unsigned short* out = (unsigned short*) outb;
    const unsigned char* processed = in;
    const unsigned char *const instart = in;
    unsigned short* outstart= out;
    unsigned short* outend;
    const unsigned char* inend;
    unsigned int c, d;
    int trailing;
    unsigned char *tmp;
    unsigned short tmp1, tmp2;

    /* UTF-16BE has no BOM */
    if ((outb == NULL) || (outlen == NULL) || (inlen == NULL)) return(-1);
    if (in == NULL) {
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    inend= in + *inlen;
    outend = out + (*outlen / 2);
    while (in < inend) {
      d= *in++;
      if      (d < 0x80)  { c= d; trailing= 0; }
      else if (d < 0xC0)  {
          /* trailing byte in leading position */
	  *outlen = out - outstart;
	  *inlen = processed - instart;
	  return(-2);
      } else if (d < 0xE0)  { c= d & 0x1F; trailing= 1; }
      else if (d < 0xF0)  { c= d & 0x0F; trailing= 2; }
      else if (d < 0xF8)  { c= d & 0x07; trailing= 3; }
      else {
          /* no chance for this in UTF-16 */
	  *outlen = out - outstart;
	  *inlen = processed - instart;
	  return(-2);
      }

      if (inend - in < trailing) {
          break;
      }

      for ( ; trailing; trailing--) {
          if ((in >= inend) || (((d= *in++) & 0xC0) != 0x80))  break;
          c <<= 6;
          c |= d & 0x3F;
      }

      /* assertion: c is a single UTF-4 value */
        if (c < 0x10000) {
            if (out >= outend)  break;
	    if (xmlLittleEndian) {
		tmp = (unsigned char *) out;
		*tmp = c >> 8;
		*(tmp + 1) = c;
		out++;
	    } else {
		*out++ = c;
	    }
        }
        else if (c < 0x110000) {
            if (out+1 >= outend)  break;
            c -= 0x10000;
	    if (xmlLittleEndian) {
		tmp1 = 0xD800 | (c >> 10);
		tmp = (unsigned char *) out;
		*tmp = tmp1 >> 8;
		*(tmp + 1) = (unsigned char) tmp1;
		out++;

		tmp2 = 0xDC00 | (c & 0x03FF);
		tmp = (unsigned char *) out;
		*tmp = tmp2 >> 8;
		*(tmp + 1) = (unsigned char) tmp2;
		out++;
	    } else {
		*out++ = 0xD800 | (c >> 10);
		*out++ = 0xDC00 | (c & 0x03FF);
	    }
        }
        else
	    break;
	processed = in;
    }
    *outlen = (out - outstart) * 2;
    *inlen = processed - instart;
    return(*outlen);
}